

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

bool __thiscall helics::CoreBroker::verifyBrokerKey(CoreBroker *this,ActionMessage *mess)

{
  string_view key;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar2;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  char *unaff_retaddr;
  ActionMessage *in_stack_ffffffffffffffd8;
  CoreBroker *this_01;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_01 = in_RDI;
  this_00 = ActionMessage::getStringData_abi_cxx11_(in_RSI);
  sVar2 = CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
  if (sVar2 < 2) {
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x509a62);
  }
  else {
    ActionMessage::getString_abi_cxx11_(in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    key._M_len._7_1_ = in_stack_ffffffffffffffff;
    key._M_len._0_7_ = in_stack_fffffffffffffff8;
    key._M_str = unaff_retaddr;
    bVar1 = verifyBrokerKey(this_01,key);
  }
  return bVar1;
}

Assistant:

bool CoreBroker::verifyBrokerKey(ActionMessage& mess) const
{
    if (mess.getStringData().size() > 1) {
        return verifyBrokerKey(mess.getString(1));
    }
    return brokerKey.empty();
}